

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void refreshMultiLine(linenoiseState *l,int flags)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint local_9c;
  undefined1 auStack_98 [4];
  uint i;
  abuf ab;
  int j;
  int fd;
  int old_rows;
  int col;
  int rpos2;
  int rpos;
  int rows;
  int colpos2;
  size_t colpos;
  size_t pcollen;
  char seq [64];
  int flags_local;
  linenoiseState *l_local;
  
  pcVar1 = l->prompt;
  seq._60_4_ = flags;
  sVar5 = strlen(l->prompt);
  sVar6 = promptTextColumnLen(pcVar1,sVar5);
  sVar7 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,sVar6);
  rpos2 = (int)(((sVar6 + sVar7 + l->cols) - 1) / l->cols);
  iVar3 = (int)((sVar6 + l->oldcolpos + l->cols) / l->cols);
  iVar4 = (int)l->oldrows;
  ab._12_4_ = l->ofd;
  l->oldrows = (long)rpos2;
  abInit((abuf *)auStack_98);
  if ((((l->oldcollen < l->len) && (l->pos == l->len)) && (l->pos <= l->cols)) &&
     (l->prev_history_index == l->history_index)) {
    pcVar1 = l->buf;
    sVar6 = l->oldcollen;
    sVar5 = strlen(l->buf);
    abAppend((abuf *)auStack_98,pcVar1 + sVar6,(int)sVar5 - (int)l->oldcollen);
    l->oldcolpos = sVar7;
    l->oldcollen = l->len;
    write(ab._12_4_,_auStack_98,(long)(int)ab.b);
    abFree((abuf *)auStack_98);
    l->prev_history_index = l->history_index;
  }
  else {
    if ((seq._60_4_ & 1) != 0) {
      if (0 < iVar4 - iVar3) {
        snprintf((char *)&pcollen,0x40,"\x1b[%dB",(ulong)(uint)(iVar4 - iVar3));
        sVar5 = strlen((char *)&pcollen);
        abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
      }
      for (ab.len = 0; ab.len < iVar4 + -1; ab.len = ab.len + 1) {
        snprintf((char *)&pcollen,0x40,"\r\x1b[0K\x1b[1A");
        sVar5 = strlen((char *)&pcollen);
        abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
      }
    }
    if ((seq._60_4_ & 3) != 0) {
      snprintf((char *)&pcollen,0x40,"\r\x1b[0K");
      sVar5 = strlen((char *)&pcollen);
      abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
    }
    sVar7 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,sVar6);
    iVar3 = (int)sVar7;
    if ((seq._60_4_ & 2) != 0) {
      pcVar1 = l->prompt;
      sVar5 = strlen(l->prompt);
      abAppend((abuf *)auStack_98,pcVar1,(int)sVar5);
      if (maskmode == 1) {
        for (local_9c = 0; (ulong)local_9c < l->len; local_9c = local_9c + 1) {
          abAppend((abuf *)auStack_98,"*",1);
        }
      }
      else {
        abAppend((abuf *)auStack_98,l->buf,(int)l->len);
      }
      refreshShowHints((abuf *)auStack_98,l,(int)sVar6);
      if (((l->pos != 0) && (l->pos == l->len)) && (((long)iVar3 + sVar6) % l->cols == 0)) {
        abAppend((abuf *)auStack_98,"\n",1);
        snprintf((char *)&pcollen,0x40,"\r");
        sVar5 = strlen((char *)&pcollen);
        abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
        rpos2 = rpos2 + 1;
        if ((int)l->oldrows < rpos2) {
          l->oldrows = (long)rpos2;
        }
      }
      iVar4 = (int)((sVar6 + (long)iVar3 + l->cols) / l->cols);
      if (0 < rpos2 - iVar4) {
        snprintf((char *)&pcollen,0x40,"\x1b[%dA",(ulong)(uint)(rpos2 - iVar4));
        sVar5 = strlen((char *)&pcollen);
        abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
      }
      uVar2 = (sVar6 + (long)iVar3) % l->cols;
      if ((int)uVar2 == 0) {
        snprintf((char *)&pcollen,0x40,"\r");
      }
      else {
        snprintf((char *)&pcollen,0x40,"\r\x1b[%dC",uVar2 & 0xffffffff);
      }
      sVar5 = strlen((char *)&pcollen);
      abAppend((abuf *)auStack_98,(char *)&pcollen,(int)sVar5);
    }
    l->oldcolpos = (long)iVar3;
    l->oldcollen = l->len;
    l->prev_history_index = l->history_index;
    write(ab._12_4_,_auStack_98,(long)(int)ab.b);
    abFree((abuf *)auStack_98);
  }
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t pcollen = promptTextColumnLen(l->prompt,strlen(l->prompt));
    size_t colpos = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int colpos2; /* cursor column position. */
    int rows = (pcollen+colpos+l->cols-1)/l->cols; /* rows used by current buf. */
    int rpos = (pcollen+l->oldcolpos+l->cols)/l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int col; /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    struct abuf ab;

    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    abInit(&ab);

    if ((l->oldcollen < l->len) && // some character was added
            (l->pos == l->len) && // at the end of the line
            (l->pos <= l->cols) && // no multiline break
            (l->prev_history_index == l->history_index) // no buffer change based on history
            ) {
        /* Ignore flags and just add one character.
         * This code was added because redundant ANSI escape codes make tcl-tests incapable.
         */
        abAppend(&ab,l->buf + l->oldcollen,strlen(l->buf) - l->oldcollen);
        l->oldcolpos = colpos;
        l->oldcollen = l->len;
        if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
        abFree(&ab);
        l->prev_history_index = l->history_index;
        return;
    }

    if (flags & REFRESH_CLEAN) {
        if (old_rows-rpos > 0) {
            lndebug("go down %d", old_rows-rpos);
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows-1; j++) {
            lndebug("clear+up");
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            abAppend(&ab,seq,strlen(seq));
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        lndebug("clear");
        snprintf(seq,64,"\r\x1b[0K");
        abAppend(&ab,seq,strlen(seq));
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        abAppend(&ab,l->prompt,strlen(l->prompt));
        if (maskmode == 1) {
            unsigned int i;
            for (i = 0; i < l->len; i++) abAppend(&ab,"*",1);
        } else {
            abAppend(&ab,l->buf,l->len);
        }

        /* Show hits if any. */
        refreshShowHints(&ab,l,pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos &&
            l->pos == l->len &&
            (colpos2+pcollen) % l->cols == 0)
        {
            lndebug("<newline>");
            abAppend(&ab,"\n",1);
            snprintf(seq,64,"\r");
            abAppend(&ab,seq,strlen(seq));
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen+colpos2+l->cols)/l->cols; /* Current cursor relative row */
        lndebug("rpos2 %d", rpos2);

        /* Go up till we reach the expected position. */
        if (rows-rpos2 > 0) {
            lndebug("go-up %d", rows-rpos2);
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Set column. */
        col = (pcollen+colpos2) % l->cols;
        lndebug("set col %d", 1+col);
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        abAppend(&ab,seq,strlen(seq));
    }

    lndebug("\n");
    l->oldcolpos = colpos2;
    l->oldcollen = l->len;
    l->prev_history_index = l->history_index;

    if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
    abFree(&ab);
}